

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cfg.cpp
# Opt level: O3

MPP_RET check_cfg_info(MppCfgInfo *node,char *name,CfgType type,char *func)

{
  CfgType CVar1;
  uint uVar2;
  MPP_RET MVar3;
  char *fmt;
  char *pcVar4;
  ulong uVar5;
  
  if (node == (MppCfgInfo *)0x0) {
    _mpp_log_l(2,"mpp_cfg","%s: cfg %s is invalid\n",(char *)0x0,func,name);
    return MPP_NOK;
  }
  pcVar4 = (char *)(ulong)type;
  if (type < CFG_FUNC_TYPE_BUTT) {
    CVar1 = node->data_type;
    uVar2 = node->data_size;
    pcVar4 = (char *)(ulong)uVar2;
    switch(type) {
    default:
      if (uVar2 == 4) {
        return MPP_OK;
      }
      break;
    case CFG_FUNC_TYPE_S64:
    case CFG_FUNC_TYPE_U64:
      if (uVar2 == 8) {
        return MPP_OK;
      }
      break;
    case CFG_FUNC_TYPE_St:
      MVar3 = MPP_OK;
      if (CVar1 != CFG_FUNC_TYPE_St) {
        uVar5 = 6;
        if (CVar1 < CFG_FUNC_TYPE_BUTT) {
          uVar5 = (ulong)CVar1;
        }
        _mpp_log_l(2,"mpp_cfg","%s cfg %s expect %s input NOT %s\n",(char *)0x0,func,name,
                   strof_cfg_type::cfg_type_names[uVar5],"struct");
        MVar3 = MPP_NOK;
      }
      if (0 < (int)uVar2) {
        return MVar3;
      }
      fmt = "%s: cfg %s found invalid size %d\n";
      goto LAB_00164437;
    case CFG_FUNC_TYPE_Ptr:
      if (CVar1 == CFG_FUNC_TYPE_Ptr) {
        return MPP_OK;
      }
      uVar5 = 6;
      if (CVar1 < CFG_FUNC_TYPE_BUTT) {
        uVar5 = (ulong)CVar1;
      }
      _mpp_log_l(2,"mpp_cfg","%s cfg %s expect %s input NOT %s\n",(char *)0x0,func,name,
                 strof_cfg_type::cfg_type_names[uVar5],"void *");
      return MPP_NOK;
    }
    uVar5 = 6;
    if (CVar1 < CFG_FUNC_TYPE_BUTT) {
      uVar5 = (ulong)CVar1;
    }
    fmt = "%s cfg %s expect %s input NOT %s\n";
    pcVar4 = strof_cfg_type::cfg_type_names[uVar5];
  }
  else {
    fmt = "%s: cfg %s found invalid cfg type %d\n";
  }
LAB_00164437:
  _mpp_log_l(2,"mpp_cfg",fmt,(char *)0x0,func,name,pcVar4);
  return MPP_NOK;
}

Assistant:

MPP_RET check_cfg_info(MppCfgInfo *node, const char *name, CfgType type,
                       const char *func)
{
    if (NULL == node) {
        mpp_err("%s: cfg %s is invalid\n", func, name);
        return MPP_NOK;
    }

    CfgType cfg_type = (CfgType)node->data_type;
    RK_S32 cfg_size = node->data_size;
    MPP_RET ret = MPP_OK;

    switch (type) {
    case CFG_FUNC_TYPE_St : {
        if (cfg_type != type) {
            show_cfg_info_err(node, type, func, name);
            ret = MPP_NOK;
        }
        if (cfg_size <= 0) {
            mpp_err("%s: cfg %s found invalid size %d\n", func, name, cfg_size);
            ret = MPP_NOK;
        }
    } break;
    case CFG_FUNC_TYPE_Ptr : {
        if (cfg_type != type) {
            show_cfg_info_err(node, type, func, name);
            ret = MPP_NOK;
        }
    } break;
    case CFG_FUNC_TYPE_S32 :
    case CFG_FUNC_TYPE_U32 : {
        if (cfg_size != sizeof(RK_S32)) {
            show_cfg_info_err(node, type, func, name);
            ret = MPP_NOK;
        }
    } break;
    case CFG_FUNC_TYPE_S64 :
    case CFG_FUNC_TYPE_U64 : {
        if (cfg_size != sizeof(RK_S64)) {
            show_cfg_info_err(node, type, func, name);
            ret = MPP_NOK;
        }
    } break;
    default : {
        mpp_err("%s: cfg %s found invalid cfg type %d\n", func, name, type);
        ret = MPP_NOK;
    } break;
    }

    return ret;
}